

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u32 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  byte bVar2;
  i16 iVar3;
  Pgno PVar4;
  int addr;
  long lVar5;
  Table *pTab;
  sqlite3 *db;
  undefined8 uVar6;
  sqlite3 *db_00;
  Index *pIdx;
  i16 *aiCol;
  _func_void_sqlite3_str_ptr_char_ptr_int *z;
  short sVar7;
  LogEst LVar8;
  ushort uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  Expr *pEVar16;
  void *pvVar17;
  Vdbe *pVVar18;
  Op *pOVar19;
  Token *pTVar20;
  ExprList *pList;
  Parse *pPVar21;
  Index *pIVar22;
  Table *pTable;
  u8 *puVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  uint uVar27;
  Index **ppIVar28;
  char *zBuf;
  char *zFormat;
  char *pcVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  uint nCol;
  long lVar33;
  Column *pCVar34;
  long in_FS_OFFSET;
  bool bVar35;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar36;
  char local_b0;
  u8 *local_a0;
  SelectDest dest;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pEnd != (Token *)0x0 || pSelect != (Select *)0x0) &&
     (pTab = pParse->pNewTable, pTab != (Table *)0x0)) {
    db = pParse->db;
    if (pSelect == (Select *)0x0) {
      iVar10 = sqlite3ShadowTableName(db,pTab->zName);
      if (iVar10 != 0) {
        pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
        *pbVar1 = *pbVar1 | 0x10;
      }
      if ((db->init).busy != '\0') {
        PVar4 = (db->init).newTnum;
        if (pTab->eTabType == '\0') {
          pTab->tnum = PVar4;
          if (PVar4 == 1) {
            *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
          }
        }
        else {
          if (PVar4 != 0) goto LAB_0015d4aa;
          pTab->tnum = 0;
        }
      }
    }
    else if ((db->init).busy != '\0') {
LAB_0015d4aa:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        pcVar29 = "";
        goto LAB_0015d4c8;
      }
      goto LAB_0015e339;
    }
    local_a0 = &(db->init).busy;
    if ((tabOpts >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)&pTab->tabFlags + 2);
      *pbVar1 = *pbVar1 | 1;
      lVar31 = 0;
      for (uVar32 = 0; (long)uVar32 < (long)pTab->nCol; uVar32 = uVar32 + 1) {
        pCVar34 = pTab->aCol;
        bVar2 = (&pCVar34->field_0x8)[lVar31];
        if (bVar2 < 0x10) {
          pcVar29 = pTab->zName;
          uVar6 = *(undefined8 *)((long)&pCVar34->zCnName + lVar31);
          if ((*(byte *)((long)&pCVar34->colFlags + lVar31) & 4) == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
              sqlite3ErrorMsg(pParse,"missing datatype for %s.%s",pcVar29,uVar6);
              return;
            }
          }
          else {
            pcVar26 = sqlite3ColumnType((Column *)((long)&pCVar34->zCnName + lVar31),"");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
              sqlite3ErrorMsg(pParse,"unknown datatype for %s.%s: \"%s\"",pcVar29,uVar6,pcVar26);
              return;
            }
          }
          goto LAB_0015e339;
        }
        if ((bVar2 & 0xf0) == 0x10) {
          (&pCVar34->affinity)[lVar31] = 'A';
        }
        if ((((*(byte *)((long)&pCVar34->colFlags + lVar31) & 1) != 0) &&
            (uVar32 != (uint)(int)pTab->iPKey)) && ((bVar2 & 0xf) == 0)) {
          (&pCVar34->field_0x8)[lVar31] = bVar2 | 2;
          pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
          *pbVar1 = *pbVar1 | 8;
        }
        lVar31 = lVar31 + 0x10;
      }
    }
    local_b0 = (char)tabOpts;
    if (local_b0 < '\0') {
      uVar15 = pTab->tabFlags;
      if ((uVar15 & 8) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
          pcVar29 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_0015d4c8:
          sqlite3ErrorMsg(pParse,pcVar29);
          return;
        }
        goto LAB_0015e339;
      }
      if ((uVar15 & 4) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
          sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
          return;
        }
        goto LAB_0015e339;
      }
      pTab->tabFlags = uVar15 | 0x280;
      db_00 = pParse->db;
      pVVar18 = pParse->pVdbe;
      if (((db_00->init).field_0x6 & 2) == 0) {
        lVar31 = 8;
        for (lVar33 = 0; lVar33 < pTab->nCol; lVar33 = lVar33 + 1) {
          pCVar34 = pTab->aCol;
          if (((*(byte *)((long)&pCVar34->zCnName + lVar31 + 6) & 1) != 0) &&
             (bVar2 = *(byte *)((long)&pCVar34->zCnName + lVar31), (bVar2 & 0xf) == 0)) {
            *(byte *)((long)&pCVar34->zCnName + lVar31) = bVar2 | 2;
          }
          lVar31 = lVar31 + 0x10;
        }
        pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((long)(pParse->u1).addrCrTab != 0) {
        if (pVVar18->db->mallocFailed == '\0') {
          pOVar19 = pVVar18->aOp + (pParse->u1).addrCrTab;
        }
        else {
          pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar19->p3 = 2;
      }
      if ((long)pTab->iPKey < 0) {
        pIVar22 = sqlite3PrimaryKeyIndex(pTab);
        iVar10 = 1;
        for (uVar32 = 1; uVar32 < pIVar22->nKeyCol; uVar32 = uVar32 + 1) {
          iVar30 = isDupColumn(pIVar22,iVar10,pIVar22,(int)uVar32);
          if (iVar30 == 0) {
            pIVar22->azColl[iVar10] = pIVar22->azColl[uVar32];
            pIVar22->aSortOrder[iVar10] = pIVar22->aSortOrder[uVar32];
            pIVar22->aiColumn[iVar10] = pIVar22->aiColumn[uVar32];
            iVar10 = iVar10 + 1;
          }
          else {
            pIVar22->nColumn = pIVar22->nColumn - 1;
          }
        }
        pIVar22->nKeyCol = (u16)iVar10;
LAB_0015dddc:
        uVar9 = *(ushort *)&pIVar22->field_0x63;
        *(ushort *)&pIVar22->field_0x63 = uVar9 | 0x20;
        if (((db_00->init).field_0x6 & 2) == 0) {
          *(ushort *)&pIVar22->field_0x63 = uVar9 | 0x28;
        }
        uVar9 = pIVar22->nKeyCol;
        uVar15 = (uint)uVar9;
        pIVar22->nColumn = uVar9;
        if ((pVVar18 != (Vdbe *)0x0) && ((long)(int)pIVar22->tnum != 0)) {
          if (pVVar18->db->mallocFailed == '\0') {
            pOVar19 = pVVar18->aOp + (int)pIVar22->tnum;
          }
          else {
            pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar19->opcode = '\t';
        }
        pIVar22->tnum = pTab->tnum;
        nCol = (uint)uVar9;
        ppIVar28 = &pTab->pIndex;
        while (pIdx = *ppIVar28, pIdx != (Index *)0x0) {
          if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
            iVar10 = 0;
            for (uVar27 = 0; nCol != uVar27; uVar27 = uVar27 + 1) {
              uVar13 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,pIVar22,uVar27);
              iVar10 = iVar10 + (uVar13 ^ 1);
            }
            if (iVar10 == 0) {
              pIdx->nColumn = pIdx->nKeyCol;
            }
            else {
              iVar10 = resizeIndexObject(db_00,pIdx,iVar10 + (uint)pIdx->nKeyCol);
              if (iVar10 != 0) goto LAB_0015d587;
              uVar27 = (uint)pIdx->nKeyCol;
              for (uVar32 = 0; nCol != uVar32; uVar32 = uVar32 + 1) {
                iVar10 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,pIVar22,(int)uVar32);
                if (iVar10 == 0) {
                  pIdx->aiColumn[(int)uVar27] = pIVar22->aiColumn[uVar32];
                  pIdx->azColl[(int)uVar27] = pIVar22->azColl[uVar32];
                  if (pIVar22->aSortOrder[uVar32] != '\0') {
                    pIdx->field_0x64 = pIdx->field_0x64 | 4;
                  }
                  uVar27 = uVar27 + 1;
                }
              }
            }
          }
          ppIVar28 = &pIdx->pNext;
        }
        uVar9 = pTab->nCol;
        uVar32 = 0;
        if ((short)uVar9 < 1) {
          uVar9 = 0;
        }
        lVar31 = 0xe;
        iVar10 = 0;
        for (; uVar9 != uVar32; uVar32 = uVar32 + 1) {
          iVar30 = hasColumn(pIVar22->aiColumn,nCol,(int)uVar32);
          if (iVar30 == 0) {
            iVar10 = iVar10 + (uint)((*(byte *)((long)&pTab->aCol->zCnName + lVar31) & 0x20) == 0);
          }
          lVar31 = lVar31 + 0x10;
        }
        iVar10 = resizeIndexObject(db_00,pIVar22,iVar10 + nCol);
        if (iVar10 == 0) {
          lVar31 = 0xe;
          for (lVar33 = 0; lVar33 < pTab->nCol; lVar33 = lVar33 + 1) {
            aiCol = pIVar22->aiColumn;
            iVar10 = hasColumn(aiCol,uVar15,(int)lVar33);
            if ((iVar10 == 0) && ((*(byte *)((long)&pTab->aCol->zCnName + lVar31) & 0x20) == 0)) {
              aiCol[(int)uVar15] = (i16)lVar33;
              pIVar22->azColl[(int)uVar15] = "BINARY";
              uVar15 = uVar15 + 1;
            }
            lVar31 = lVar31 + 0x10;
          }
          recomputeColumnsNotIndexed(pIVar22);
        }
      }
      else {
        dest.iSDParm2 = -0x55555556;
        dest.iSdst = -0x55555556;
        dest._0_8_ = pTab->aCol[pTab->iPKey].zCnName;
        dest.iSDParm2 = sqlite3Strlen30((char *)dest._0_8_);
        pEVar16 = sqlite3ExprAlloc(db_00,0x3c,(Token *)&dest,0);
        pList = sqlite3ExprListAppendNew(pParse->db,pEVar16);
        if (pList != (ExprList *)0x0) {
          if (1 < pParse->eParseMode) {
            sqlite3RenameTokenRemap(pParse,pList->a[0].pExpr,&pTab->iPKey);
          }
          pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
          pTab->iPKey = -1;
          in_stack_ffffffffffffff08 = 0;
          sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                             (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
          if (pParse->nErr == 0) {
            pIVar22 = sqlite3PrimaryKeyIndex(pTab);
            goto LAB_0015dddc;
          }
        }
        *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags & 0x7f;
      }
    }
LAB_0015d587:
    iVar10 = sqlite3SchemaToIndex(db,pTab->pSchema);
    if ((pTab->pCheck != (ExprList *)0x0) &&
       (sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck), pParse->nErr != 0)) {
      sqlite3ExprListDelete(db,pTab->pCheck);
      pTab->pCheck = (ExprList *)0x0;
    }
    if ((pTab->tabFlags & 0x60) == 0) {
      sVar7 = pTab->nCol;
    }
    else {
      lVar33 = 0;
      iVar30 = 0;
      for (lVar31 = 0; sVar7 = pTab->nCol, lVar31 < sVar7; lVar31 = lVar31 + 1) {
        if ((*(byte *)((long)&pTab->aCol->colFlags + lVar33) & 0x60) == 0) {
          iVar30 = iVar30 + 1;
        }
        else {
          pEVar16 = sqlite3ColumnExpr(pTab,(Column *)((long)&pTab->aCol->zCnName + lVar33));
          iVar11 = sqlite3ResolveSelfReference(pParse,pTab,8,pEVar16,(ExprList *)0x0);
          if (iVar11 != 0) {
            pCVar34 = pTab->aCol;
            pEVar16 = sqlite3ExprAlloc(db,0x7a,(Token *)0x0,0);
            sqlite3ColumnSetExpr(pParse,pTab,(Column *)((long)&pCVar34->zCnName + lVar33),pEVar16);
          }
        }
        lVar33 = lVar33 + 0x10;
      }
      if (iVar30 == 0) {
        sqlite3ErrorMsg(pParse,"must have at least one non-generated column");
        goto LAB_0015dda8;
      }
    }
    puVar23 = &pTab->aCol->szEst;
    iVar11 = 0;
    for (iVar30 = (int)sVar7; 0 < iVar30; iVar30 = iVar30 + -1) {
      iVar11 = iVar11 + (uint)*puVar23;
      puVar23 = puVar23 + 0x10;
    }
    LVar8 = sqlite3LogEst((ulong)((iVar11 + (uint)((ushort)pTab->iPKey >> 0xf)) * 4));
    pTab->szTabRow = LVar8;
    ppIVar28 = &pTab->pIndex;
    while (pIVar22 = *ppIVar28, pIVar22 != (Index *)0x0) {
      estimateIndexWidth(pIVar22);
      ppIVar28 = &pIVar22->pNext;
    }
    if (*local_a0 == '\0') {
      pVVar18 = sqlite3GetVdbe(pParse);
      if (pVVar18 != (Vdbe *)0x0) {
        sqlite3VdbeAddOp1(pVVar18,0x7a,0);
        uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        bVar35 = pTab->eTabType == '\0';
        pcVar29 = "view";
        if (bVar35) {
          pcVar29 = "table";
        }
        pcVar26 = "VIEW";
        if (bVar35) {
          pcVar26 = "TABLE";
        }
        if (pSelect == (Select *)0x0) {
          pTVar20 = &pParse->sLastToken;
          if (tabOpts == 0) {
            pTVar20 = pEnd;
          }
          uVar15 = (int)pTVar20->z - (int)(pParse->sNameToken).z;
          if (*pTVar20->z != ';') {
            uVar15 = uVar15 + pTVar20->n;
          }
          pcVar26 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar26,(ulong)uVar15);
LAB_0015da79:
          sqlite3NestedParse(pParse,
                             "UPDATE %Q.sqlite_master SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                             ,db->aDb[iVar10].zDbSName,pcVar29,pTab->zName,pTab->zName,
                             CONCAT44(uVar36,pParse->regRoot),pcVar26,pParse->regRowid);
          sqlite3DbFree(db,pcVar26);
          sqlite3ChangeCookie(pParse,iVar10);
          if ((((pTab->tabFlags & 8) != 0) && (pParse->eParseMode == '\0')) &&
             ((db->aDb[iVar10].pSchema)->pSeqTab == (Table *)0x0)) {
            sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",
                               db->aDb[iVar10].zDbSName);
          }
          pcVar29 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
          sqlite3VdbeAddParseSchemaOp(pVVar18,iVar10,pcVar29,0);
          if ((pTab->tabFlags & 0x60) != 0) {
            pcVar29 = sqlite3MPrintf(db,"SELECT*FROM\"%w\".\"%w\"",db->aDb[iVar10].zDbSName);
            sqlite3VdbeAddOp4(pVVar18,0x94,1,0,0,pcVar29,-6);
          }
          if (*local_a0 != '\0') goto LAB_0015d829;
          goto joined_r0x0015dbb6;
        }
        dest.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        dest.nSdst = -0x55555556;
        dest._20_4_ = 0xaaaaaaaa;
        dest.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
        dest._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        dest.iSDParm2 = -0x55555556;
        dest.iSdst = -0x55555556;
        if (pParse->eParseMode == '\0') {
          iVar12 = pParse->nTab;
          iVar14 = pParse->nMem;
          pParse->nTab = iVar12 + 1;
          iVar30 = iVar14 + 1;
          iVar11 = iVar14 + 3;
          pParse->nMem = iVar11;
          pPVar21 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar21 = pParse;
          }
          pPVar21->mayAbort = '\x01';
          sqlite3VdbeAddOp3(pVVar18,0x71,iVar12,pParse->regRoot,iVar10);
          addr = pVVar18->nOp;
          if (0 < (long)addr) {
            pVVar18->aOp[(long)addr + -1].p5 = 0x10;
          }
          sqlite3VdbeAddOp3(pVVar18,0xb,iVar30,0,addr + 1);
          if ((pParse->nErr == 0) &&
             (pTable = sqlite3ResultSetOfSelect(pParse,pSelect,'A'), pTable != (Table *)0x0)) {
            iVar3 = pTable->nCol;
            pTab->nNVCol = iVar3;
            pTab->nCol = iVar3;
            pTab->aCol = pTable->aCol;
            pTable->nCol = 0;
            pTable->aCol = (Column *)0x0;
            sqlite3DeleteTable(db,pTable);
            dest.eDest = '\r';
            dest.iSDParm = iVar30;
            dest.iSDParm2 = 0;
            dest.zAffSdst = (char *)0x0;
            dest.iSdst = 0;
            dest.nSdst = 0;
            sqlite3Select(pParse,pSelect,&dest);
            if (pParse->nErr == 0) {
              sqlite3VdbeEndCoroutine(pVVar18,iVar30);
              sqlite3VdbeJumpHere(pVVar18,addr);
              iVar30 = sqlite3VdbeAddOp1(pVVar18,0xc,dest.iSDParm);
              sqlite3VdbeAddOp3(pVVar18,0x61,dest.iSdst,dest.nSdst,iVar14 + 2);
              lVar31 = 0;
              sqlite3TableAffinity(pVVar18,pTab,0);
              sqlite3VdbeAddOp2(pVVar18,0x7f,iVar12,iVar11);
              sqlite3VdbeAddOp3(pVVar18,0x80,iVar12,iVar14 + 2,iVar11);
              sqlite3VdbeGoto(pVVar18,iVar30);
              sqlite3VdbeJumpHere(pVVar18,iVar30);
              sqlite3VdbeAddOp1(pVVar18,0x7a,iVar12);
              pCVar34 = pTab->aCol;
              sVar7 = pTab->nCol;
              iVar30 = 0;
              if (0 < sVar7) {
                iVar30 = (int)sVar7;
              }
              iVar11 = 0;
              for (; iVar30 << 4 != (int)lVar31; lVar31 = lVar31 + 0x10) {
                iVar12 = identLength(*(char **)((long)&pCVar34->zCnName + lVar31));
                iVar11 = iVar11 + iVar12 + 5;
              }
              iVar30 = identLength(pTab->zName);
              iVar30 = iVar30 + iVar11;
              pcVar24 = ",\n  ";
              if (iVar30 < 0x32) {
                pcVar24 = ",";
              }
              pcVar25 = "\n)";
              if (iVar30 < 0x32) {
                pcVar25 = ")";
              }
              iVar11 = sVar7 * 6 + iVar30 + 0x23;
              pcVar26 = (char *)sqlite3Malloc((long)iVar11);
              uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
              if (pcVar26 == (char *)0x0) {
                sqlite3OomFault(db);
              }
              else {
                zFormat = "\n  ";
                if (iVar30 < 0x32) {
                  zFormat = "";
                }
                sqlite3_snprintf(iVar11,pcVar26,"CREATE TABLE ");
                iVar30 = sqlite3Strlen30(pcVar26);
                dest._0_4_ = iVar30;
                identPut(pcVar26,(int *)&dest,pTab->zName);
                iVar30 = dest._0_4_ + 1;
                pcVar26[(int)dest._0_4_] = '(';
                pCVar34 = pTab->aCol;
                iVar12 = 0;
                while( true ) {
                  uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                  zBuf = pcVar26 + iVar30;
                  if (pTab->nCol <= iVar12) break;
                  sqlite3_snprintf(iVar11 - iVar30,zBuf,zFormat);
                  iVar14 = sqlite3Strlen30(zBuf);
                  dest._0_4_ = iVar14 + iVar30;
                  identPut(pcVar26,(int *)&dest,pCVar34->zCnName);
                  z = (&sqlite3Apis.str_append)[pCVar34->affinity];
                  uVar15 = sqlite3Strlen30((char *)z);
                  uVar36 = dest._0_4_;
                  memcpy(pcVar26 + (int)dest._0_4_,z,(ulong)uVar15);
                  iVar30 = uVar15 + uVar36;
                  dest._0_4_ = iVar30;
                  iVar12 = iVar12 + 1;
                  pCVar34 = pCVar34 + 1;
                  zFormat = pcVar24;
                }
                sqlite3_snprintf(iVar11 - iVar30,zBuf,"%s",pcVar25);
              }
              goto LAB_0015da79;
            }
          }
        }
        else {
          pParse->rc = 1;
          pParse->nErr = pParse->nErr + 1;
        }
      }
    }
    else {
LAB_0015d829:
      pvVar17 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
      if (pvVar17 == (void *)0x0) {
        pParse->pNewTable = (Table *)0x0;
        *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
        iVar10 = strcmp(pTab->zName,"sqlite_sequence");
        if (iVar10 == 0) {
          pTab->pSchema->pSeqTab = pTab;
        }
joined_r0x0015dbb6:
        if ((pSelect == (Select *)0x0) && (pTab->eTabType == '\0')) {
          if (pCons->z != (char *)0x0) {
            pEnd = pCons;
          }
          (pTab->u).tab.addColOffset = (*(int *)&pEnd->z - *(int *)&(pParse->sNameToken).z) + 0xd;
        }
      }
      else {
        sqlite3OomFault(db);
      }
    }
  }
LAB_0015dda8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
LAB_0015e339:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u32 tabOpts,            /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && sqlite3ShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_schema" or "sqlite_temp_schema" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_schema
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect || (!IsOrdinaryTable(p) && db->init.newTnum) ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for tables that include the STRICT keyword:
  **
  **   *  Do not allow custom column datatypes.  Every column must have
  **      a datatype that is one of INT, INTEGER, REAL, TEXT, or BLOB.
  **
  **   *  If a PRIMARY KEY is defined, other than the INTEGER PRIMARY KEY,
  **      then all columns of the PRIMARY KEY must have a NOT NULL
  **      constraint.
  */
  if( tabOpts & TF_Strict ){
    int ii;
    p->tabFlags |= TF_Strict;
    for(ii=0; ii<p->nCol; ii++){
      Column *pCol = &p->aCol[ii];
      if( pCol->eCType==COLTYPE_CUSTOM ){
        if( pCol->colFlags & COLFLAG_HASTYPE ){
          sqlite3ErrorMsg(pParse,
            "unknown datatype for %s.%s: \"%s\"",
            p->zName, pCol->zCnName, sqlite3ColumnType(pCol, "")
          );
        }else{
          sqlite3ErrorMsg(pParse, "missing datatype for %s.%s",
                          p->zName, pCol->zCnName);
        }
        return;
      }else if( pCol->eCType==COLTYPE_ANY ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( (pCol->colFlags & COLFLAG_PRIMKEY)!=0
       && p->iPKey!=ii
       && pCol->notNull == OE_None
      ){
        pCol->notNull = OE_Abort;
        p->tabFlags |= TF_HasNotNull;
      }
    }
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
      return;
    }
    p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
    convertToWithoutRowidTable(pParse, p);
  }
  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
    if( pParse->nErr ){
      /* If errors are seen, delete the CHECK constraints now, else they might
      ** actually be used if PRAGMA writable_schema=ON is set. */
      sqlite3ExprListDelete(db, p->pCheck);
      p->pCheck = 0;
    }else{
      markExprListImmutable(p->pCheck);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  if( p->tabFlags & TF_HasGenerated ){
    int ii, nNG = 0;
    testcase( p->tabFlags & TF_HasVirtual );
    testcase( p->tabFlags & TF_HasStored );
    for(ii=0; ii<p->nCol; ii++){
      u32 colFlags = p->aCol[ii].colFlags;
      if( (colFlags & COLFLAG_GENERATED)!=0 ){
        Expr *pX = sqlite3ColumnExpr(p, &p->aCol[ii]);
        testcase( colFlags & COLFLAG_VIRTUAL );
        testcase( colFlags & COLFLAG_STORED );
        if( sqlite3ResolveSelfReference(pParse, p, NC_GenCol, pX, 0) ){
          /* If there are errors in resolving the expression, change the
          ** expression to a NULL.  This prevents code generators that operate
          ** on the expression from inserting extra parts into the expression
          ** tree that have been allocated from lookaside memory, which is
          ** illegal in a schema and will lead to errors or heap corruption
          ** when the database connection closes. */
          sqlite3ColumnSetExpr(pParse, p, &p->aCol[ii],
               sqlite3ExprAlloc(db, TK_NULL, 0, 0));
        }
      }else{
        nNG++;
      }
    }
    if( nNG==0 ){
      sqlite3ErrorMsg(pParse, "must have at least one non-generated column");
      return;
    }
  }
#endif

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the schema table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /*
    ** Initialize zType for the new view or table.
    */
    if( IsOrdinaryTable(p) ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */
      int iCsr;           /* Write cursor on the new table */

      if( IN_SPECIAL_PARSE ){
        pParse->rc = SQLITE_ERROR;
        pParse->nErr++;
        return;
      }
      iCsr = pParse->nTab++;
      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, iCsr, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect, SQLITE_AFF_BLOB);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = p->nNVCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iCsr, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iCsr, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, iCsr);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db,
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE
      " SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q"
      " WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 && !IN_SPECIAL_PARSE ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName),0);

    /* Test for cycles in generated columns and illegal expressions
    ** in CHECK constraints and in DEFAULT clauses. */
    if( p->tabFlags & TF_HasGenerated ){
      sqlite3VdbeAddOp4(v, OP_SqlExec, 0x0001, 0, 0,
             sqlite3MPrintf(db, "SELECT*FROM\"%w\".\"%w\"",
                   db->aDb[iDb].zDbSName, p->zName), P4_DYNAMIC);
    }
  }

  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( HasRowid(p) || p->iPKey<0 );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

    /* If this is the magic sqlite_sequence table used by autoincrement,
    ** then record a pointer to this table in the main database structure
    ** so that INSERT can find the table easily.  */
    assert( !pParse->nested );
#ifndef SQLITE_OMIT_AUTOINCREMENT
    if( strcmp(p->zName, "sqlite_sequence")==0 ){
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      p->pSchema->pSeqTab = p;
    }
#endif
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( !pSelect && IsOrdinaryTable(p) ){
    assert( pCons && pEnd );
    if( pCons->z==0 ){
      pCons = pEnd;
    }
    p->u.tab.addColOffset = 13 + (int)(pCons->z - pParse->sNameToken.z);
  }
#endif
}